

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int ssa_delete_insn_if_dead_p(gen_ctx_t gen_ctx,bb_insn_t_conflict bb_insn)

{
  MIR_insn_t insn;
  int iVar1;
  
  iVar1 = ssa_dead_insn_p(gen_ctx,bb_insn);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
      fwrite("  deleting now dead insn ",0x19,1,(FILE *)gen_ctx->debug_file);
      print_bb_insn(gen_ctx,bb_insn,0);
    }
    insn = bb_insn->insn;
    remove_insn_ssa_edges(insn);
    gen_delete_insn(gen_ctx,insn);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int ssa_delete_insn_if_dead_p (gen_ctx_t gen_ctx, bb_insn_t bb_insn) {
  if (!ssa_dead_insn_p (gen_ctx, bb_insn)) return FALSE;
  DEBUG (2, {
    fprintf (debug_file, "  deleting now dead insn ");
    print_bb_insn (gen_ctx, bb_insn, FALSE);
  });
  ssa_delete_insn (gen_ctx, bb_insn->insn);
  return TRUE;
}